

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

bool __thiscall cmCTestP4::DescribeParser::ProcessLine(DescribeParser *this)

{
  SectionType SVar1;
  
  if ((this->super_LineParser).Line._M_string_length == 0) {
    NextSection(this);
  }
  else {
    SVar1 = this->Section;
    if (SVar1 == SectionDiff) {
      DoDiffLine(this);
    }
    else if (SVar1 == SectionBody) {
      DoBodyLine(this);
    }
    else if (SVar1 == SectionHeader) {
      DoHeaderLine(this);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line.empty()) {
      this->NextSection();
    } else {
      switch (this->Section) {
        case SectionHeader:
          this->DoHeaderLine();
          break;
        case SectionBody:
          this->DoBodyLine();
          break;
        case SectionDiffHeader:
          break; // nothing to do
        case SectionDiff:
          this->DoDiffLine();
          break;
        case SectionCount:
          break; // never happens
      }
    }
    return true;
  }